

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O1

void __thiscall deqp::gles3::Functional::Framebuffer::checkCompleteness(Framebuffer *this)

{
  deUint32 reason;
  FboIncompleteException *this_00;
  
  (*this->m_context->_vptr_Context[9])(this->m_context,0x8d40,(ulong)this->m_framebuffer);
  reason = (*this->m_context->_vptr_Context[0x21])(this->m_context,0x8d40);
  (*this->m_context->_vptr_Context[9])(this->m_context,0x8d40,0);
  if (reason == 0x8cd5) {
    return;
  }
  this_00 = (FboIncompleteException *)__cxa_allocate_exception(0x38);
  FboTestUtil::FboIncompleteException::FboIncompleteException
            (this_00,reason,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
             ,0x14a);
  __cxa_throw(this_00,&FboTestUtil::FboIncompleteException::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Framebuffer::checkCompleteness (void)
{
	m_context.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	GLenum status = m_context.checkFramebufferStatus(GL_FRAMEBUFFER);
	m_context.bindFramebuffer(GL_FRAMEBUFFER, 0);
	if (status != GL_FRAMEBUFFER_COMPLETE)
		throw FboIncompleteException(status, __FILE__, __LINE__);
}